

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

void __thiscall RenX::Server::wipePlayers(Server *this)

{
  Plugin *pPVar1;
  bool bVar2;
  size_type sVar3;
  Core *this_00;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *this_01;
  reference ppPVar4;
  reference pvVar5;
  Plugin **plugin;
  iterator __end2;
  iterator __begin2;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *__range2;
  Server *this_local;
  
  while( true ) {
    sVar3 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                      (&this->players);
    if (sVar3 == 0) break;
    this_00 = getCore();
    this_01 = Core::getPlugins(this_00);
    __end2 = std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::begin(this_01);
    plugin = (Plugin **)std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::end(this_01);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                        (&__end2,(__normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                                  *)&plugin);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      ppPVar4 = __gnu_cxx::
                __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                ::operator*(&__end2);
      pPVar1 = *ppPVar4;
      pvVar5 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::front
                         (&this->players);
      (**(code **)(*(long *)pPVar1 + 0xf8))(pPVar1,this,pvVar5);
      __gnu_cxx::
      __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::pop_front
              (&this->players);
  }
  this->m_player_rdns_resolutions_pending = 0;
  return;
}

Assistant:

void RenX::Server::wipePlayers() {
	while (this->players.size() != 0) {
		for (const auto& plugin : RenX::getCore()->getPlugins()) {
			plugin->RenX_OnPlayerDelete(*this, this->players.front());
		}
		this->players.pop_front();
	}

	m_player_rdns_resolutions_pending = 0;
}